

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_option_name_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  undefined7 in_register_00000009;
  bool all_options;
  
  all_options = (int)CONCAT71(in_register_00000009,is_positional) == 0;
  Option::get_name_abi_cxx11_(__return_storage_ptr__,opt,!all_options,all_options);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_name(const Option *opt, bool is_positional) const {
    if(is_positional)
        return opt->get_name(true, false);
    else
        return opt->get_name(false, true);
}